

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLInputUnshared.cpp
# Opt level: O2

String * COLLADASaxFWL::InputUnshared::getSemanticAsString_abi_cxx11_(Semantic semantic)

{
  if ((uint)semantic < 0x17) {
    return (String *)(&PTR_SEMANTIC_BINORMAL_abi_cxx11__009fe840)[(uint)semantic];
  }
  return (String *)COLLADAFW::Constants::EMPTY_STRING_abi_cxx11_;
}

Assistant:

const String& InputUnshared::getSemanticAsString ( const InputSemantic::Semantic semantic )
    {
        switch ( semantic )
        {
        case InputSemantic::BINORMAL: return Constants::SEMANTIC_BINORMAL;
        case InputSemantic::COLOR: return Constants::SEMANTIC_COLOR;
        case InputSemantic::CONTINUITY: return Constants::SEMANTIC_CONTINUITY;
        case InputSemantic::IMAGE: return Constants::SEMANTIC_IMAGE;
        case InputSemantic::INPUT: return Constants::SEMANTIC_INPUT;
        case InputSemantic::IN_TANGENT: return Constants::SEMANTIC_IN_TANGENT;
        case InputSemantic::INTERPOLATION: return Constants::SEMANTIC_INTERPOLATION;
        case InputSemantic::INV_BIND_MATRIX: return Constants::SEMANTIC_INV_BIND_MATRIX;
        case InputSemantic::JOINT: return Constants::SEMANTIC_JOINT;
        case InputSemantic::LINEAR_STEPS: return Constants::SEMANTIC_LINEAR_STEPS;
        case InputSemantic::MORPH_TARGET: return Constants::SEMANTIC_MORPH_TARGET;
        case InputSemantic::MORPH_WEIGHT: return Constants::SEMANTIC_MORPH_WEIGHT;
        case InputSemantic::NORMAL: return Constants::SEMANTIC_NORMAL;
        case InputSemantic::OUTPUT: return Constants::SEMANTIC_OUTPUT;
        case InputSemantic::OUT_TANGENT: return Constants::SEMANTIC_OUT_TANGENT;
        case InputSemantic::POSITION: return Constants::SEMANTIC_POSITION;
        case InputSemantic::TANGENT: return Constants::SEMANTIC_TANGENT;
        case InputSemantic::TEXBINORMAL: return Constants::SEMANTIC_TEXBINORMAL;
        case InputSemantic::TEXCOORD: return Constants::SEMANTIC_TEXCOORD;
        case InputSemantic::TEXTANGENT: return Constants::SEMANTIC_TEXTANGENT;
        case InputSemantic::UV: return Constants::SEMANTIC_UV;
        case InputSemantic::VERTEX: return Constants::SEMANTIC_VERTEX;
        case InputSemantic::WEIGHT: return Constants::SEMANTIC_WEIGHT;
        case InputSemantic::UNKNOWN:  
        default: return Constants::EMPTY_STRING;
        }
    }